

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint64_t *puVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  void *fd_ctx;
  ulong uVar5;
  long pts;
  undefined1 local_48 [8];
  FdOutContext out;
  FdInputContext in;
  
  iVar3 = parse_opt_open_file(argc,argv);
  iVar4 = -1;
  if (iVar3 == 0) {
    fd_ctx = hevc_fast_dec_create((FdInputContext *)&out.width);
    divide_nalus();
    uVar5 = (ulong)au_pos;
    au_buf[uVar5] = buf_size;
    if (uVar5 != 0) {
      pts = 0;
      uVar5 = 0;
      do {
        puVar1 = au_buf + uVar5;
        lVar2 = uVar5 + 1;
        uVar5 = uVar5 + 1;
        hevc_fast_dec_decode
                  (buf + *puVar1,au_buf[lVar2] - *puVar1,pts,fd_ctx,(FdOutContext *)local_48);
        pts = pts + 0x28;
      } while (uVar5 < au_pos);
    }
    hevc_fast_dec_free(fd_ctx);
    free(buf);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int main(int argc, char * const *argv)
{
    FdOutContext out;
    FdInputContext in;
    if(parse_opt_open_file(argc, argv))
        return -1;

    void *fd_ctx = hevc_fast_dec_create(&in);
    divide_nalus();

    au_buf[au_pos] = buf_size;
//    for(int i = 0; i <= au_pos; i++)
//        printf("%d\n", au_buf[i]);
    for(int i = 0; i < au_pos; i++)
    {
        int64_t pts = i * 40; //25fps
        hevc_fast_dec_decode(buf + au_buf[i], au_buf[i + 1] - au_buf[i], pts, fd_ctx, &out);
        if(out.got_frame)
        {
            //render
        }
    }



    hevc_fast_dec_free(fd_ctx);
    free(buf);
    return 0;
}